

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::restoreInitialBasis
          (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  Representation RVar2;
  int iVar3;
  SPxStatus SVar4;
  Status SVar5;
  int iVar6;
  int iVar7;
  Status *pSVar8;
  SPxId *pSVar9;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Verbosity old_verbosity;
  int in_stack_00000164;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000168;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000001d8;
  int in_stack_000001e0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Status in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  SPxStatus in_stack_ffffffffffffffbc;
  Status in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  DataKey in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  SPxStatus local_20;
  DataKey local_1c;
  int local_14;
  undefined4 local_10;
  Verbosity local_c [3];
  
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar1 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar1)) {
    local_c[0] = SPxOut::getVerbosity(in_RDI->spxout);
    local_10 = 5;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_10);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_c);
  }
  RVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(in_RDI->theLP);
  if (RVar2 == COLUMN) {
    local_14 = 0;
    while (in_stack_ffffffffffffffc4 = local_14,
          iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6a4948), in_stack_ffffffffffffffc4 < iVar3) {
      in_stack_ffffffffffffffc0 = dualRowStatus(in_stack_00000168,in_stack_00000164);
      pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               ,in_stack_ffffffffffffffac);
      *pSVar8 = in_stack_ffffffffffffffc0;
      local_1c = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::rId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                in_stack_ffffffffffffffb4);
      pSVar9 = baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
      SPxId::operator=(pSVar9,(SPxRowId *)&local_1c);
      local_14 = local_14 + 1;
    }
    local_20 = REGULAR;
    while (in_stack_ffffffffffffffbc = local_20,
          SVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6a49e2), in_stack_ffffffffffffffbc < SVar4) {
      SVar5 = primalColStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_000001e0,in_stack_000001d8);
      pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               ,in_stack_ffffffffffffffac);
      *pSVar8 = SVar5;
      local_20 = local_20 + DUAL;
    }
  }
  else {
    local_24 = 0;
    while (iVar3 = local_24,
          iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6a4a4d), iVar3 < iVar6) {
      in_stack_ffffffffffffffb0 = dualRowStatus(in_stack_00000168,in_stack_00000164);
      pSVar8 = Desc::rowStatus((Desc *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac);
      *pSVar8 = in_stack_ffffffffffffffb0;
      local_24 = local_24 + 1;
    }
    local_28 = 0;
    while (iVar6 = local_28,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x6a4aaf), iVar6 < iVar7) {
      SVar5 = primalColStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_000001e0,in_stack_000001d8);
      pSVar8 = Desc::colStatus((Desc *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),iVar6);
      *pSVar8 = SVar5;
      in_stack_ffffffffffffffd0 =
           (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::cId((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),iVar3);
      pSVar9 = baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),iVar6);
      SPxId::operator=(pSVar9,(SPxColId *)&stack0xffffffffffffffd0);
      local_28 = local_28 + 1;
    }
  }
  SVar4 = status(in_RDI);
  if ((NO_PROBLEM < SVar4) && ((in_RDI->matrixIsSetup & 1U) != 0)) {
    loadMatrixVecs((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffffd0);
  }
  setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void SPxBasisBase<R>::restoreInitialBasis()
{
   assert(!factorized);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ICHBAS10 setup slack basis" << std::endl;)

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(int i = 0; i < theLP->nRows(); ++i)
      {
         thedesc.rowStatus(i) = dualRowStatus(i);
         baseId(i) = theLP->SPxLPBase<R>::rId(i);
      }

      for(int i = 0; i < theLP->nCols(); ++i)
         thedesc.colStatus(i) = primalColStatus(i, theLP);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);

      for(int i = 0; i < theLP->nRows(); ++i)
         thedesc.rowStatus(i) = dualRowStatus(i);

      for(int i = 0; i < theLP->nCols(); ++i)
      {
         thedesc.colStatus(i) = primalColStatus(i, theLP);
         baseId(i) = theLP->SPxLPBase<R>::cId(i);
      }
   }

   /* if matrix was set up, load new basis vectors to the matrix */
   if(status() > NO_PROBLEM && matrixIsSetup)
      loadMatrixVecs();

   /* update basis status */
   setStatus(REGULAR);
}